

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

double interp_cubic(double *p,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *p;
  dVar2 = p[1];
  dVar3 = p[2];
  return (x * ((((dVar2 - dVar3) * 3.0 + p[3]) - dVar1) * x +
              ((dVar3 * 4.0 + dVar1 + dVar1 + dVar2 * -5.0) - p[3])) + (dVar3 - dVar1)) * x * 0.5 +
         dVar2;
}

Assistant:

static double interp_cubic(const double *p, double x) {
  return p[1] + 0.5 * x *
                    (p[2] - p[0] +
                     x * (2.0 * p[0] - 5.0 * p[1] + 4.0 * p[2] - p[3] +
                          x * (3.0 * (p[1] - p[2]) + p[3] - p[0])));
}